

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall higan::FileForAppend::FileForAppend(FileForAppend *this,string *url)

{
  char *__filename;
  FILE *pFVar1;
  string *url_local;
  FileForAppend *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)url);
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"ae");
  this->file_fp_ = (FILE *)pFVar1;
  this->write_sum_bytes_ = 0;
  if (this->file_fp_ != (FILE *)0x0) {
    setbuffer((FILE *)this->file_fp_,this->buffer,0x8000);
    return;
  }
  __assert_fail("file_fp_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/File.cpp"
                ,0x60,"higan::FileForAppend::FileForAppend(const std::string &)");
}

Assistant:

FileForAppend::FileForAppend(const std::string& url) :
		url_(url),
		file_fp_(fopen(url.c_str(), "ae")), // a O_WRONLY | O_CREAT | O_APPEND e O_CLOEXEC
		write_sum_bytes_(0)
{
	assert(file_fp_);
	setbuffer(file_fp_, buffer, sizeof buffer);
}